

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::buildAndUseProgram
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *pTVar6;
  char *geometry_shader_code_ptr;
  string local_3b8;
  string local_398;
  string geometry_shader_code;
  string local_358;
  stringstream n_iterations_sstream;
  undefined1 local_328 [376];
  stringstream max_vertices_sstream;
  undefined1 local_1a0 [376];
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  this->m_program_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not create a program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x14f);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not create a fragment shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x153);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not create a vertex shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x156);
  if (this->m_fbo_layered == '\0') {
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_program_id,this->m_fragment_shader_id,1,
                       &m_fragment_shader_code,this->m_vertex_shader_id,1,&m_vertex_shader_code,
                       (bool *)0x0);
    if (!bVar1) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "Program could not have been created sucessfully from valid vertex/fragment shaders"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                 ,0x175);
      goto LAB_00d4c4dc;
    }
  }
  else {
    geometry_shader_code._M_dataplus._M_p = (pointer)&geometry_shader_code.field_2;
    geometry_shader_code._M_string_length = 0;
    geometry_shader_code.field_2._M_local_buf[0] = '\0';
    geometry_shader_code_ptr = (char *)0x0;
    std::__cxx11::stringstream::stringstream((stringstream *)&max_vertices_sstream);
    std::__cxx11::stringstream::stringstream((stringstream *)&n_iterations_sstream);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::ostream::_M_insert<unsigned_long>((ulong)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    getGeometryShaderCode(&local_358,this,&local_398,&local_3b8);
    std::__cxx11::string::operator=((string *)&geometry_shader_code,(string *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_398);
    geometry_shader_code_ptr = geometry_shader_code._M_dataplus._M_p;
    GVar3 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_geometry_shader_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create a geometry shader object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                    ,0x166);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_program_id,this->m_fragment_shader_id,1,
                       &m_fragment_shader_code,this->m_geometry_shader_id,1,
                       &geometry_shader_code_ptr,this->m_vertex_shader_id,1,&m_vertex_shader_code,
                       (bool *)0x0);
    if (!bVar1) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "Program could not have been created sucessfully from valid vertex/geometry/fragment shaders"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                 ,0x16c);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&n_iterations_sstream);
    std::__cxx11::stringstream::~stringstream((stringstream *)&max_vertices_sstream);
    std::__cxx11::string::~string((string *)&geometry_shader_code);
  }
  (**(code **)(lVar5 + 0x1680))(this->m_program_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x17d);
  iVar2 = (**(code **)(lVar5 + 0x780))(this->m_program_id,"vertex_position");
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x180);
  if (iVar2 != -1) {
    (**(code **)(lVar5 + 0x19f0))(iVar2,4,0x1406,0,0,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not configure vertex_position vertex attribute array",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                    ,0x188);
    (**(code **)(lVar5 + 0x610))(iVar2);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not enable vertex attribute array!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                    ,0x18b);
    return;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"vertex_position attribute is considered inactive",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
             ,0x184);
LAB_00d4c4dc:
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayStencilAttachments::buildAndUseProgram(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a program object */
	m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a program object");

	/* Create shader objects that will make up the program object */
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a fragment shader object");

	m_vertex_shader_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a vertex shader object");

	if (m_fbo_layered)
	{
		std::string		  geometry_shader_code;
		const char*		  geometry_shader_code_ptr = DE_NULL;
		std::stringstream max_vertices_sstream;
		std::stringstream n_iterations_sstream;

		max_vertices_sstream << m_cube_map_array_data[test_index].getDepth() * m_n_vertices_gs;
		n_iterations_sstream << m_cube_map_array_data[test_index].getDepth();

		geometry_shader_code	 = getGeometryShaderCode(max_vertices_sstream.str(), n_iterations_sstream.str());
		geometry_shader_code_ptr = geometry_shader_code.c_str();

		m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a geometry shader object");

		/* Build a program object */
		if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_geometry_shader_id, 1,
						  &geometry_shader_code_ptr, m_vertex_shader_id, 1, &m_vertex_shader_code))
		{
			TCU_FAIL("Program could not have been created sucessfully from valid vertex/geometry/fragment shaders");
		}
	} /* if (m_fbo_layered) */
	else
	{
		/* Build a program object */
		if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_vertex_shader_id, 1,
						  &m_vertex_shader_code))
		{
			TCU_FAIL("Program could not have been created sucessfully from valid vertex/fragment shaders");
		}
	}

	/* Use program */
	glw::GLint posAttrib = -1;

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	posAttrib = gl.getAttribLocation(m_program_id, "vertex_position");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");

	if (posAttrib == -1)
	{
		TCU_FAIL("vertex_position attribute is considered inactive");
	}

	gl.vertexAttribPointer(posAttrib, 4, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure vertex_position vertex attribute array");

	gl.enableVertexAttribArray(posAttrib);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");
}